

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void parse_whitespace(D_Parser *ap,d_loc_t *loc,void **p_globals)

{
  int iVar1;
  Parser *p;
  SNode *pSVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  uint old_line;
  uint old_col;
  Parser *pp;
  void **p_globals_local;
  d_loc_t *loc_local;
  D_Parser *ap_local;
  
  p = (Parser *)ap[3].initial_scope;
  p->start = loc->s;
  iVar4 = exhaustive_parse(p,*(int *)&(ap[1].initial_scope)->updates);
  if ((iVar4 == 0) && (p->accept != (SNode *)0x0)) {
    iVar4 = loc->col;
    iVar1 = loc->line;
    pSVar2 = p->accept;
    loc->s = (pSVar2->loc).s;
    loc->pathname = (pSVar2->loc).pathname;
    loc->ws = (pSVar2->loc).ws;
    iVar3 = (pSVar2->loc).line;
    loc->col = (pSVar2->loc).col;
    loc->line = iVar3;
    if (loc->line == 1) {
      loc->col = iVar4 + loc->col;
    }
    loc->line = iVar1 + (p->accept->loc).line + -1;
    uVar5 = p->accept->refcount - 1;
    p->accept->refcount = uVar5;
    if (uVar5 == 0) {
      free_SNode(p,p->accept);
    }
    p->accept = (SNode *)0x0;
  }
  return;
}

Assistant:

void parse_whitespace(D_Parser *ap, d_loc_t *loc, void **p_globals) {
  Parser *pp = ((Parser *)ap)->whitespace_parser;
  (void)p_globals;
  pp->start = loc->s;
  if (!exhaustive_parse(pp, ((Parser *)ap)->t->whitespace_state)) {
    if (pp->accept) {
      uint old_col = loc->col, old_line = loc->line;
      *loc = pp->accept->loc;
      if (loc->line == 1) loc->col = old_col + loc->col;
      loc->line = old_line + (pp->accept->loc.line - 1);
      unref_sn(pp, pp->accept);
      pp->accept = NULL;
    }
  }
}